

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_AigGetLevelizedOrder(Abc_Ntk_t *pNtk,int fCollectCis)

{
  void *pvVar1;
  uint uVar2;
  uint *__ptr;
  void *pvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar11;
  uint uVar12;
  size_t __size;
  ulong uVar10;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_NtkCleanCopy(pNtk);
    uVar2 = Abc_AigSetChoiceLevels(pNtk);
    uVar12 = uVar2 + 1;
    __ptr = (uint *)malloc(0x10);
    uVar8 = 8;
    if (6 < uVar2) {
      uVar8 = uVar12;
    }
    *__ptr = uVar8;
    if (uVar8 == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = malloc((long)(int)uVar8 << 3);
    }
    *(void **)(__ptr + 2) = pvVar3;
    __ptr[1] = uVar12;
    memset(pvVar3,0,(long)(int)uVar12 << 3);
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar4 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar4];
        if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
          iVar9 = *(int *)((long)pvVar1 + 0x40);
          *(undefined8 *)((long)pvVar1 + 0x40) = *(undefined8 *)((long)pvVar3 + (long)iVar9 * 8);
          *(void **)((long)pvVar3 + (long)iVar9 * 8) = pvVar1;
          pVVar5 = pNtk->vObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar5->nSize);
    }
    uVar8 = pNtk->nObjCounts[7];
    uVar10 = (ulong)uVar8;
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    uVar11 = 8;
    if (6 < uVar8 - 1) {
      uVar11 = uVar8;
    }
    pVVar5->nCap = uVar11;
    if (uVar11 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)(int)uVar11 << 3);
    }
    pVVar5->pArray = ppvVar6;
    pVVar5->nSize = uVar8;
    memset(ppvVar6,0,(long)(int)uVar8 << 3);
    if ((int)(uint)(fCollectCis == 0) <= (int)uVar2) {
      uVar7 = (ulong)(fCollectCis == 0);
      do {
        pvVar3 = *(void **)(*(long *)(__ptr + 2) + uVar7 * 8);
        if (pvVar3 != (void *)0x0) {
          iVar9 = (int)uVar10;
          uVar10 = (ulong)iVar9;
          uVar8 = iVar9 * 2;
          __size = uVar10 << 4;
          do {
            if ((uint)uVar10 == uVar11) {
              ppvVar6 = pVVar5->pArray;
              if ((long)uVar10 < 0x10) {
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,0x80);
                }
                pVVar5->pArray = ppvVar6;
                uVar11 = 0x10;
              }
              else {
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc(__size);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,__size);
                }
                pVVar5->pArray = ppvVar6;
                uVar11 = uVar8;
              }
            }
            else {
              ppvVar6 = pVVar5->pArray;
            }
            ppvVar6[uVar10] = pvVar3;
            uVar10 = uVar10 + 1;
            pvVar3 = *(void **)((long)pvVar3 + 0x40);
            uVar8 = uVar8 + 2;
            __size = __size + 0x10;
          } while (pvVar3 != (void *)0x0);
          pVVar5->nSize = (int)uVar10;
          pVVar5->nCap = uVar11;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar12);
      pvVar3 = *(void **)(__ptr + 2);
    }
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
    free(__ptr);
    return pVVar5;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                ,0x72e,"Vec_Ptr_t *Abc_AigGetLevelizedOrder(Abc_Ntk_t *, int)");
}

Assistant:

Vec_Ptr_t * Abc_AigGetLevelizedOrder( Abc_Ntk_t * pNtk, int fCollectCis )
{
    Vec_Ptr_t * vNodes, * vLevels;
    Abc_Obj_t * pNode, ** ppHead;
    int LevelMax, i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the correct levels
    Abc_NtkCleanCopy( pNtk );
    LevelMax = Abc_AigSetChoiceLevels( pNtk );
    // relink nodes by level
    vLevels = Vec_PtrStart( LevelMax + 1 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        ppHead = ((Abc_Obj_t **)vLevels->pArray) + (int)(ABC_PTRINT_T)pNode->pCopy;
        pNode->pCopy = *ppHead;
        *ppHead = pNode;
    }
    // recollect nodes
    vNodes = Vec_PtrStart( Abc_NtkNodeNum(pNtk) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vLevels, pNode, i, !fCollectCis )
        for ( ; pNode; pNode = pNode->pCopy )
            Vec_PtrPush( vNodes, pNode );
    Vec_PtrFree( vLevels );
    return vNodes;
}